

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O2

void __thiscall
Logger::write_log(Logger *this,char *file_name,char *tn_callbackname,int line_no,log_level level,
                 char *format,...)

{
  mutex *__mutex;
  char in_AL;
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  FILE *pFVar6;
  uint uVar7;
  lock_guard<std::mutex> lck;
  uint uVar8;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  my_time mVar9;
  va_list valst;
  string log_str;
  undefined1 local_e8 [48];
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  mVar9 = get_current_sys_time();
  uVar4 = mVar9._0_8_;
  __mutex = &this->l_mutex;
  std::mutex::lock(__mutex);
  lVar5 = this->l_count + 1;
  this->l_count = lVar5;
  uVar8 = mVar9._2_4_ >> 0x18;
  uVar7 = mVar9._1_4_ >> 0x18;
  if ((this->l_today != uVar8) || (lVar5 % (long)this->l_split_lines == 0)) {
    if (2 < pr_level) {
      printf("[%-5s][%s:%d] start to create a new log file\n","debug","write_log",0xa3);
    }
    memset(&log_str,0,0x12d);
    fflush((FILE *)this->l_fp);
    fclose((FILE *)this->l_fp);
    valst[0].reg_save_area = (void *)0x0;
    valst[0].gp_offset = 0;
    valst[0].fp_offset = 0;
    valst[0].overflow_arg_area = (void *)0x0;
    snprintf((char *)valst,0x17,"%04d_%02d_%02d_",uVar4 & 0xffffffff,(ulong)uVar7,(ulong)uVar8);
    if (this->l_today == uVar8) {
      snprintf((char *)&log_str,300,"%s%s%s.%lld",this,valst,this->l_file_name,
               this->l_count / (long)this->l_split_lines);
    }
    else {
      snprintf((char *)&log_str,300,"%s%s%s",this,valst,this->l_file_name);
      this->l_today = uVar8;
      this->l_count = 0;
    }
    pFVar6 = fopen((char *)&log_str,"a");
    this->l_fp = (FILE *)pFVar6;
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  valst[0].reg_save_area = local_e8;
  valst[0].overflow_arg_area = &stack0x00000008;
  valst[0].gp_offset = 0x30;
  valst[0].fp_offset = 0x30;
  log_str._M_dataplus._M_p = (pointer)&log_str.field_2;
  log_str._M_string_length = 0;
  log_str.field_2._M_local_buf[0] = '\0';
  std::mutex::lock(__mutex);
  iVar2 = snprintf(this->l_buf,300,"%04d-%02d-%02d %02d:%02d:%02d %s [%s:%s:%d] ",uVar4 & 0xffffffff
                   ,(ulong)uVar7,(ulong)uVar8,(ulong)(uint)(mVar9._3_4_ >> 0x18),(long)uVar4 >> 0x38
                   ,(ulong)(uint)(int)mVar9.second,LogLevelName[level],file_name,tn_callbackname,
                   _line_no);
  iVar3 = vsnprintf(this->l_buf + iVar2,(long)this->l_buf_size - 1,format,valst);
  this->l_buf[iVar2 + iVar3] = '\n';
  this->l_buf[(long)(iVar2 + iVar3) + 1] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&log_str,this->l_buf);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (this->l_is_async == true) {
    do {
      bVar1 = buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::push(this->l_buffer_queue,&log_str);
      if (bVar1) break;
    } while (((this->is_thread_stop)._M_base._M_i & 1U) == 0);
  }
  else {
    std::mutex::lock(__mutex);
    fputs(log_str._M_dataplus._M_p,(FILE *)this->l_fp);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  std::__cxx11::string::~string((string *)&log_str);
  return;
}

Assistant:

void Logger::write_log(const char* file_name, const char* tn_callbackname, int line_no, log_level level, const char *format, ...)
{
    my_time my_tm = get_current_sys_time();

    {
        lock_guard<mutex> lck (l_mutex);
        l_count++;

        if (l_today != my_tm.day || l_count % l_split_lines == 0)
        {
            PR_DEBUG("start to create a new log file\n");
            char new_file_name[301] = {0};
            fflush(l_fp);
            fclose(l_fp);
            char prefix[24] = {0};
        
            snprintf(prefix, 23, "%04d_%02d_%02d_", my_tm.year, my_tm.month, my_tm.day);
        
            if (l_today != my_tm.day)
            {
                snprintf(new_file_name, 300, "%s%s%s", l_dir_name, prefix, l_file_name);
                l_today = my_tm.day;
                l_count = 0;
            }
            else
            {
                snprintf(new_file_name, 300, "%s%s%s.%lld", l_dir_name, prefix, l_file_name, l_count / l_split_lines);
            }
            l_fp = fopen(new_file_name, "a");
        }
    }

    va_list valst;
    va_start(valst, format);

    string log_str;
    {
        lock_guard<mutex> lck (l_mutex);;

        int n = snprintf(l_buf, 300, "%04d-%02d-%02d %02d:%02d:%02d %s [%s:%s:%d] ",
                        my_tm.year, my_tm.month, my_tm.day,
                            my_tm.hour, my_tm.minute, my_tm.second, LogLevelName[level],
                            file_name, tn_callbackname, line_no);
        
        int m = vsnprintf(l_buf + n, l_buf_size - 1, format, valst);
        l_buf[n + m] = '\n';
        l_buf[n + m + 1] = '\0';
        log_str = l_buf;
    }
    va_end(valst);
    

    if (l_is_async)
    {
        while (!l_buffer_queue->push(log_str) && !is_thread_stop)   //FIXME: use tm_condvar replacing busy loop
        {               
        }
        
    }
    else
    {
        lock_guard<mutex> lck (l_mutex);
        fputs(log_str.c_str(), l_fp);   
    }
}